

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-graph.cpp
# Opt level: O3

void __thiscall
llm_graph_input_attn_no_cache::set_input(llm_graph_input_attn_no_cache *this,llama_ubatch *ubatch)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  void *pvVar4;
  llama_seq_id **pplVar5;
  int32_t *piVar6;
  llama_hparams *plVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  char cVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  int s0;
  ulong uVar16;
  ulong uVar17;
  int s0_1;
  undefined8 uVar18;
  ulong uVar19;
  long lVar20;
  long lVar21;
  int iVar22;
  int iVar23;
  long lVar24;
  ulong uVar25;
  ulong uVar26;
  long lVar27;
  int iVar29;
  undefined1 auVar28 [16];
  float fVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  ulong local_98;
  ulong local_80;
  
  if (this->kq_mask != (ggml_tensor *)0x0) {
    bVar1 = this->cparams->causal_attn;
    uVar2 = ubatch->n_tokens;
    uVar14 = (ulong)uVar2;
    uVar3 = ubatch->n_seq_tokens;
    uVar25 = (ulong)uVar3;
    uVar15 = (ulong)ubatch->n_seqs;
    cVar11 = ggml_backend_buffer_is_host(this->kq_mask->buffer);
    auVar10 = _DAT_002350d0;
    auVar9 = _DAT_002350c0;
    auVar8 = _DAT_002350b0;
    if (bVar1 == true) {
      if (cVar11 == '\0') {
        uVar18 = 0x154;
LAB_001ab08b:
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-graph.cpp"
                   ,uVar18,"GGML_ASSERT(%s) failed","ggml_backend_buffer_is_host(kq_mask->buffer)");
      }
      if (uVar15 != 0) {
        pvVar4 = this->kq_mask->data;
        pplVar5 = ubatch->seq_id;
        local_98 = 0;
        do {
          if (uVar25 != 0) {
            iVar13 = *pplVar5[local_98];
            piVar6 = ubatch->n_seq_id;
            uVar17 = 0;
            do {
              lVar24 = (long)(int)((int)local_98 * uVar3 + (int)uVar17);
              uVar16 = 0;
              do {
                uVar2 = piVar6[uVar16];
                plVar7 = this->hparams;
                uVar19 = 0;
                do {
                  iVar22 = (int)uVar19 + (int)uVar16 * uVar3;
                  if (0 < (int)uVar2) {
                    uVar26 = 0;
                    do {
                      if ((pplVar5[uVar16][uVar26] == iVar13) &&
                         (iVar12 = ubatch->pos[iVar22], iVar29 = ubatch->pos[lVar24],
                         iVar23 = iVar12 - iVar29, iVar23 == 0 || iVar12 < iVar29)) {
                        fVar30 = 0.0;
                        if (plVar7->use_alibi == true) {
                          iVar12 = -iVar23;
                          if (iVar23 < 1) {
                            iVar12 = iVar23;
                          }
                          fVar30 = (float)iVar12;
                        }
                        goto LAB_001aad2c;
                      }
                      uVar26 = uVar26 + 1;
                    } while (uVar2 != uVar26);
                  }
                  fVar30 = -INFINITY;
LAB_001aad2c:
                  *(float *)((long)pvVar4 + (long)iVar22 * 4 + lVar24 * uVar14 * 4) = fVar30;
                  uVar19 = uVar19 + 1;
                } while (uVar19 != uVar25);
                uVar16 = uVar16 + 1;
              } while (uVar16 != uVar15);
              uVar17 = uVar17 + 1;
            } while (uVar17 != uVar25);
          }
          local_98 = local_98 + 1;
        } while (local_98 != uVar15);
      }
    }
    else {
      if (cVar11 == '\0') {
        uVar18 = 0x17a;
        goto LAB_001ab08b;
      }
      if (uVar15 != 0) {
        pvVar4 = this->kq_mask->data;
        pplVar5 = ubatch->seq_id;
        lVar20 = (long)(int)uVar2;
        lVar24 = (uVar14 - lVar20) + -1;
        auVar28._8_4_ = (int)lVar24;
        auVar28._0_8_ = lVar24;
        auVar28._12_4_ = (int)((ulong)lVar24 >> 0x20);
        iVar13 = 0;
        auVar28 = auVar28 ^ _DAT_002350d0;
        local_80 = 0;
        do {
          if (uVar25 != 0) {
            iVar22 = *pplVar5[local_80];
            piVar6 = ubatch->n_seq_id;
            uVar17 = 0;
            iVar12 = iVar13;
            do {
              lVar24 = (long)iVar12 * uVar14 * 4 + lVar20 * 4 + 0xc;
              lVar21 = (long)(int)((int)local_80 * uVar3 + (int)uVar17);
              uVar16 = 0;
              do {
                uVar2 = piVar6[uVar16];
                plVar7 = this->hparams;
                uVar19 = 0;
                do {
                  lVar27 = (long)(int)(uVar3 * (int)uVar16 + (int)uVar19);
                  fVar30 = -INFINITY;
                  if (0 < (int)uVar2) {
                    uVar26 = 0;
                    do {
                      if (pplVar5[uVar16][uVar26] == iVar22) {
                        fVar30 = 0.0;
                        if (plVar7->use_alibi == true) {
                          iVar23 = ubatch->pos[lVar27] - ubatch->pos[lVar21];
                          iVar29 = -iVar23;
                          if (iVar23 < 1) {
                            iVar29 = iVar23;
                          }
                          fVar30 = (float)iVar29;
                        }
                        goto LAB_001aaf1b;
                      }
                      uVar26 = uVar26 + 1;
                    } while (uVar2 != uVar26);
                    fVar30 = -INFINITY;
                  }
LAB_001aaf1b:
                  *(float *)((long)pvVar4 + lVar27 * 4 + lVar21 * uVar14 * 4) = fVar30;
                  uVar19 = uVar19 + 1;
                } while (uVar19 != uVar25);
                uVar16 = uVar16 + 1;
              } while (uVar16 != uVar15);
              if (lVar20 < (long)uVar14) {
                uVar16 = 0;
                do {
                  auVar31._8_4_ = (int)uVar16;
                  auVar31._0_8_ = uVar16;
                  auVar31._12_4_ = (int)(uVar16 >> 0x20);
                  auVar32 = (auVar31 | auVar9) ^ auVar10;
                  iVar29 = auVar28._4_4_;
                  if ((bool)(~(iVar29 < auVar32._4_4_ ||
                              auVar28._0_4_ < auVar32._0_4_ && auVar32._4_4_ == iVar29) & 1)) {
                    *(undefined4 *)((long)pvVar4 + uVar16 * 4 + lVar24 + -0xc) = 0xff800000;
                  }
                  if (auVar32._12_4_ <= auVar28._12_4_ &&
                      (auVar32._8_4_ <= auVar28._8_4_ || auVar32._12_4_ != auVar28._12_4_)) {
                    *(undefined4 *)((long)pvVar4 + uVar16 * 4 + lVar24 + -8) = 0xff800000;
                  }
                  auVar31 = (auVar31 | auVar8) ^ auVar10;
                  iVar23 = auVar31._4_4_;
                  if (iVar23 <= iVar29 && (iVar23 != iVar29 || auVar31._0_4_ <= auVar28._0_4_)) {
                    *(undefined4 *)((long)pvVar4 + uVar16 * 4 + lVar24 + -4) = 0xff800000;
                    *(undefined4 *)((long)pvVar4 + uVar16 * 4 + lVar24) = 0xff800000;
                  }
                  uVar16 = uVar16 + 4;
                } while (((uVar14 - lVar20) + 3 & 0xfffffffffffffffc) != uVar16);
              }
              uVar17 = uVar17 + 1;
              iVar12 = iVar12 + 1;
            } while (uVar17 != uVar25);
          }
          local_80 = local_80 + 1;
          iVar13 = iVar13 + uVar3;
        } while (local_80 != uVar15);
      }
    }
  }
  return;
}

Assistant:

void llm_graph_input_attn_no_cache::set_input(const llama_ubatch * ubatch) {
    if (kq_mask) {
        if (cparams.causal_attn) {
            const int64_t n_kv         = ubatch->n_tokens;
            const int64_t n_tokens     = ubatch->n_tokens;
            const int64_t n_seq_tokens = ubatch->n_seq_tokens;
            const int64_t n_seqs       = ubatch->n_seqs;

            GGML_ASSERT(ggml_backend_buffer_is_host(kq_mask->buffer));
            float * data = (float *) kq_mask->data;

            for (int h = 0; h < 1; ++h) {
                for (int s1 = 0; s1 < n_seqs; ++s1) {
                    const llama_seq_id seq_id = ubatch->seq_id[s1][0];

                    for (int j = 0; j < n_seq_tokens; ++j) {
                        const int32_t tj = s1*n_seq_tokens + j;

                        for (int s0 = 0; s0 < n_seqs; ++s0) {
                            for (int i = 0; i < n_seq_tokens; ++i) {
                                const int32_t ti = s0*n_seq_tokens + i;
                                float f = -INFINITY;

                                for (int s = 0; s < ubatch->n_seq_id[s0]; ++s) {
                                    if (ubatch->seq_id[s0][s] == seq_id && ubatch->pos[ti] <= ubatch->pos[tj]) {
                                        if (hparams.use_alibi) {
                                            f = -std::abs(ubatch->pos[ti] - ubatch->pos[tj]);
                                        } else {
                                            f = 0.0f;
                                        }
                                        break;
                                    }
                                }

                                data[h*(n_kv*n_tokens) + tj*n_kv + ti] = f;
                            }
                        }
                    }
                }
            }
        } else {
            const int64_t n_tokens     = ubatch->n_tokens;
            const int64_t n_seq_tokens = ubatch->n_seq_tokens;
            const int64_t n_seqs       = ubatch->n_seqs;
            const int64_t n_stride     = ubatch->n_tokens;

            GGML_ASSERT(ggml_backend_buffer_is_host(kq_mask->buffer));

            float * data = (float *) kq_mask->data;

            for (int h = 0; h < 1; ++h) {
                for (int s1 = 0; s1 < n_seqs; ++s1) {
                    const llama_seq_id seq_id = ubatch->seq_id[s1][0];

                    for (int j = 0; j < n_seq_tokens; ++j) {
                        const int32_t tj = s1*n_seq_tokens + j;

                        for (int s0 = 0; s0 < n_seqs; ++s0) {
                            for (int i = 0; i < n_seq_tokens; ++i) {
                                const int32_t ti = s0*n_seq_tokens + i;
                                float f = -INFINITY;

                                for (int s = 0; s < ubatch->n_seq_id[s0]; ++s) {
                                    if (ubatch->seq_id[s0][s] == seq_id) {
                                        if (hparams.use_alibi) {
                                            f = -std::abs(ubatch->pos[ti] - ubatch->pos[tj]);
                                        } else {
                                            f = 0.0f;
                                        }
                                        break;
                                    }
                                }

                                data[h*(n_tokens*n_tokens) + tj*n_stride + ti] = f;
                            }
                        }

                        for (int i = n_tokens; i < n_stride; ++i) {
                            data[h*(n_tokens*n_tokens) + tj*n_stride + i] = -INFINITY;
                        }
                    }
                }
            }
        }
    }
}